

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void gimage::imageSelect<unsigned_short,gimage::PixelTraits<unsigned_short>>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *ret,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int j)

{
  unsigned_short ***pppuVar1;
  unsigned_short ***pppuVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long i;
  long lVar6;
  
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (ret,image->width,image->height,1);
  lVar5 = 0;
  lVar3 = image->width;
  if (image->width < 1) {
    lVar3 = lVar5;
  }
  lVar4 = image->height;
  if (image->height < 1) {
    lVar4 = lVar5;
  }
  for (; lVar5 != lVar4; lVar5 = lVar5 + 1) {
    pppuVar1 = image->img;
    pppuVar2 = ret->img;
    for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 1) {
      (*pppuVar2)[lVar5][lVar6] = pppuVar1[j][lVar5][lVar6];
    }
  }
  return;
}

Assistant:

void imageSelect(Image<T, traits> &ret, const Image<T, traits> &image, int j)
{
  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, j));
    }
  }
}